

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O3

D_Scope * new_D_Scope(D_Scope *parent)

{
  D_Scope *pDVar1;
  D_SymHash *pDVar2;
  D_Sym **ppDVar3;
  
  pDVar1 = (D_Scope *)calloc(1,0x50);
  if (parent == (D_Scope *)0x0) {
    pDVar2 = (D_SymHash *)calloc(1,0x30);
    pDVar2->grow = 0x1883;
    (pDVar2->syms).n = 0xc41;
    ppDVar3 = (D_Sym **)calloc(1,0x6208);
    (pDVar2->syms).v = ppDVar3;
    pDVar1->hash = pDVar2;
  }
  else {
    pDVar1->depth = parent->depth + 1;
    *(byte *)pDVar1 = *(byte *)parent & 3;
    pDVar1->search = parent;
    pDVar1->up = parent;
    pDVar1->up_updates = parent;
    pDVar1->down_next = parent->down;
    parent->down = pDVar1;
  }
  return pDVar1;
}

Assistant:

D_Scope *new_D_Scope(D_Scope *parent) {
  D_Scope *st = MALLOC(sizeof(D_Scope));
  memset(st, 0, sizeof(D_Scope));
  if (parent) {
    st->depth = parent->depth + 1;
    st->kind = parent->kind;
    st->search = parent;
    st->up = parent;
    st->up_updates = parent;
    st->down_next = parent->down;
    parent->down = st;
  } else
    st->hash = new_D_SymHash();
  return st;
}